

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O2

string * fs_cpu_arch_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  utsname buf;
  allocator<char> local_18f;
  utsname local_18e;
  
  iVar1 = uname(&local_18e);
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,local_18e.machine,&local_18f);
  }
  else {
    fs_print_error("","fs_cpu_arch");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  return in_RDI;
}

Assistant:

std::string fs_cpu_arch()
{
#ifdef HAVE_UTSNAME

  if (struct utsname buf;
       uname(&buf) == 0)
    return buf.machine;

  fs_print_error("", __func__);
#elif defined(_WIN32)
// https://learn.microsoft.com/en-us/windows/win32/api/sysinfoapi/ns-sysinfoapi-system_info
    SYSTEM_INFO si;
    GetNativeSystemInfo(&si);
    switch (si.wProcessorArchitecture) {
    case PROCESSOR_ARCHITECTURE_AMD64:
        return "x86_64";
    case PROCESSOR_ARCHITECTURE_ARM:
        return "arm";
    case PROCESSOR_ARCHITECTURE_ARM64:
        return "arm64";
    case PROCESSOR_ARCHITECTURE_IA64:
        return "ia64";
    case PROCESSOR_ARCHITECTURE_INTEL:
        return "x86";
    case PROCESSOR_ARCHITECTURE_UNKNOWN:
    default:
        return "unknown";
    }
#endif

  return {};
}